

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

LocalFederateId __thiscall helics::CommonCore::getFederateId(CommonCore *this,string_view name)

{
  shared_mutex *__rwlock;
  const_iterator cVar1;
  LocalFederateId LVar2;
  _Head_base<0UL,_helics::FederateState_*,_false> _Var3;
  key_type local_50;
  
  __rwlock = &(this->federates).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,name._M_str,name._M_str + name._M_len);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->federates).m_obj.lookup._M_h,&local_50);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    _Var3._M_head_impl = (FederateState *)0x0;
  }
  else {
    _Var3._M_head_impl =
         *(FederateState **)
          &(this->federates).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur + 0x28)]._M_t;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((tuple<helics::FederateState_*,_std::default_delete<helics::FederateState>_>)
      _Var3._M_head_impl == (_Head_base<0UL,_helics::FederateState_*,_false>)0x0) {
    LVar2.fid = -2000000000;
  }
  else {
    LVar2.fid = ((_Var3._M_head_impl)->local_id).fid;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (LocalFederateId)LVar2.fid;
}

Assistant:

LocalFederateId CommonCore::getFederateId(std::string_view name) const
{
    auto feds = federates.lock();
    auto* fed = feds->find(std::string(name));
    if (fed != nullptr) {
        return fed->local_id;
    }

    return {};
}